

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PostEmscripten.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_0::SegmentRemover::visitMemoryInit(SegmentRemover *this,MemoryInit *curr)

{
  bool bVar1;
  Module *wasm;
  Drop *any;
  Drop *append;
  Drop *args;
  Block *expression;
  Builder local_20;
  Builder builder;
  MemoryInit *curr_local;
  SegmentRemover *this_local;
  
  builder.wasm = (Module *)curr;
  bVar1 = IString::operator==(&(this->segment).super_IString,&(curr->segment).super_IString);
  if (bVar1) {
    wasm = Walker<wasm::(anonymous_namespace)::SegmentRemover,_wasm::Visitor<wasm::(anonymous_namespace)::SegmentRemover,_void>_>
           ::getModule(&(this->
                        super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::SegmentRemover,_wasm::Visitor<wasm::(anonymous_namespace)::SegmentRemover,_void>_>_>
                        ).
                        super_PostWalker<wasm::(anonymous_namespace)::SegmentRemover,_wasm::Visitor<wasm::(anonymous_namespace)::SegmentRemover,_void>_>
                        .
                        super_Walker<wasm::(anonymous_namespace)::SegmentRemover,_wasm::Visitor<wasm::(anonymous_namespace)::SegmentRemover,_void>_>
                      );
    Builder::Builder(&local_20,wasm);
    any = Builder::makeDrop(&local_20,
                            (Expression *)
                            ((builder.wasm)->functions).
                            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
    append = Builder::makeDrop(&local_20,
                               (Expression *)
                               ((builder.wasm)->functions).
                               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    args = Builder::makeDrop(&local_20,
                             (Expression *)
                             ((builder.wasm)->globals).
                             super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
    expression = Builder::blockify<wasm::Drop*>
                           (&local_20,(Expression *)any,(Expression *)append,args);
    Walker<wasm::(anonymous_namespace)::SegmentRemover,_wasm::Visitor<wasm::(anonymous_namespace)::SegmentRemover,_void>_>
    ::replaceCurrent(&(this->
                      super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::SegmentRemover,_wasm::Visitor<wasm::(anonymous_namespace)::SegmentRemover,_void>_>_>
                      ).
                      super_PostWalker<wasm::(anonymous_namespace)::SegmentRemover,_wasm::Visitor<wasm::(anonymous_namespace)::SegmentRemover,_void>_>
                      .
                      super_Walker<wasm::(anonymous_namespace)::SegmentRemover,_wasm::Visitor<wasm::(anonymous_namespace)::SegmentRemover,_void>_>
                     ,(Expression *)expression);
  }
  return;
}

Assistant:

void visitMemoryInit(MemoryInit* curr) {
    if (segment == curr->segment) {
      Builder builder(*getModule());
      replaceCurrent(builder.blockify(builder.makeDrop(curr->dest),
                                      builder.makeDrop(curr->offset),
                                      builder.makeDrop(curr->size)));
    }
  }